

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O1

bool cfd::core::SchnorrSignature::IsValidSigHashType(uint8_t sighash_type_value)

{
  if ((char)sighash_type_value < '\0') {
    if (sighash_type_value < 0x84 && sighash_type_value != 0x80) {
      return true;
    }
  }
  else if ((char)sighash_type_value < '\x04') {
    return true;
  }
  return false;
}

Assistant:

bool SchnorrSignature::IsValidSigHashType(uint8_t sighash_type_value) {
  bool is_anyone_can_pay = (sighash_type_value & 0x80) ? true : false;
  if ((is_anyone_can_pay &&
       ((sighash_type_value <= 0x80) || (sighash_type_value > 0x83))) ||
      ((!is_anyone_can_pay) && (sighash_type_value > 0x03))) {
    return false;
  }
  return true;
}